

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::CreateLocalGenerators(cmGlobalGenerator *this)

{
  bool bVar1;
  int iVar2;
  size_type __n;
  reference ppcVar3;
  undefined4 extraout_var;
  value_type local_30;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_28;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_20;
  __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_18;
  const_iterator it;
  cmGlobalGenerator *this_local;
  
  it._M_current = (cmMakefile **)this;
  cmDeleteAll<std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>>
            (&this->LocalGenerators);
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::clear
            (&this->LocalGenerators);
  __n = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::size(&this->Makefiles);
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::reserve
            (&this->LocalGenerators,__n);
  local_20._M_current =
       (cmMakefile **)
       std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin(&this->Makefiles);
  __gnu_cxx::
  __normal_iterator<cmMakefile*const*,std::vector<cmMakefile*,std::allocator<cmMakefile*>>>::
  __normal_iterator<cmMakefile**>
            ((__normal_iterator<cmMakefile*const*,std::vector<cmMakefile*,std::allocator<cmMakefile*>>>
              *)&local_18,&local_20);
  while( true ) {
    local_28._M_current =
         (cmMakefile **)
         std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end(&this->Makefiles);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
              ::operator*(&local_18);
    iVar2 = (*this->_vptr_cmGlobalGenerator[2])(this,*ppcVar3);
    local_30 = (value_type)CONCAT44(extraout_var,iVar2);
    std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
              (&this->LocalGenerators,&local_30);
    __gnu_cxx::
    __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateLocalGenerators()
{
  cmDeleteAll(this->LocalGenerators);
  this->LocalGenerators.clear();
  this->LocalGenerators.reserve(this->Makefiles.size());
  for (std::vector<cmMakefile*>::const_iterator it = this->Makefiles.begin();
       it != this->Makefiles.end(); ++it)
    {
    this->LocalGenerators.push_back(this->CreateLocalGenerator(*it));
    }
}